

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<long_double>::ComputeWeightsLocal
          (TPZDohrSubstruct<long_double> *this,TPZFMatrix<long_double> *StiffnessDiagLocal)

{
  int iVar1;
  ulong uVar2;
  longdouble *plVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int local_38;
  
  uVar2 = (this->fGlobalEqs).fNElements;
  uVar6 = (uint)uVar2;
  if (0 < (int)uVar6) {
    plVar3 = (this->fWeights).super_TPZVec<long_double>.fStore;
    lVar11 = 0;
    uVar9 = 0;
    do {
      iVar1 = *(int *)((long)&((this->fGlobalEqs).fStore)->first + lVar11);
      if (((StiffnessDiagLocal->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <=
           (long)uVar9) ||
         ((StiffnessDiagLocal->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      plVar3[iVar1] = plVar3[iVar1] / *(longdouble *)((long)StiffnessDiagLocal->fElem + lVar11 * 2);
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 8;
    } while ((uVar6 & 0x7fffffff) != uVar9);
  }
  lVar11 = (this->fInternalEqs).fNElements;
  if (0 < lVar11) {
    piVar4 = (this->fInternalEqs).fStore;
    plVar3 = (this->fWeights).super_TPZVec<long_double>.fStore;
    lVar8 = 0;
    do {
      plVar3[piVar4[lVar8]] = (longdouble)1;
      lVar8 = lVar8 + 1;
    } while (lVar11 != lVar8);
  }
  uVar9 = (this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol;
  TPZFMatrix<long_double>::Resize(&this->fPhiC_Weighted_Condensed,(long)(int)uVar6,uVar9);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      local_38 = (int)uVar9;
      if (0 < local_38) {
        uVar10 = 0;
        do {
          lVar11 = (long)(this->fGlobalEqs).fStore[uVar7].first;
          if (((lVar11 < 0) ||
              (lVar8 = (this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow,
              lVar8 <= lVar11)) ||
             ((this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= (long)uVar10))
          {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = (this->fPhiC_Weighted_Condensed).super_TPZMatrix<long_double>.super_TPZBaseMatrix.
                  fRow;
          if ((lVar5 <= (long)uVar7) ||
             ((this->fPhiC_Weighted_Condensed).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol
              <= (long)uVar10)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (this->fPhiC_Weighted_Condensed).fElem[lVar5 * uVar10 + uVar7] =
               (this->fWeights).super_TPZVec<long_double>.fStore[lVar11] *
               (this->fPhiC).fElem[lVar8 * uVar10 + lVar11];
          uVar10 = uVar10 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uVar2 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		fWeights[ind.first] = fWeights[ind.first] / StiffnessDiagLocal(i,0);
	}
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fWeights[fInternalEqs[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	int c,nc = fPhiC.Cols();
#ifdef ZERO_INTERNAL_RESIDU
	// eliminate the values of v2 for internal equations
	int nint = fInternalEqs.NElements();
	for(i=0; i<nint; i++)
	{
		for(c=0; c<nc; c++)
		{
			fPhiC(fInternalEqs[i],c) = 0.;
		}
	}
#endif
	fPhiC_Weighted_Condensed.Resize(neqs,fPhiC.Cols());
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			std::pair<int,int> ind = fGlobalEqs[i];
			fPhiC_Weighted_Condensed(i,c) = fPhiC(ind.first,c)*fWeights[ind.first];
		}
	}
}